

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_fspic.cpp
# Opt level: O0

int HU_FSDisplay(uint handle,bool newval)

{
  bool bVar1;
  uint uVar2;
  TArray<FHudPic,_FHudPic> *this;
  FHudPic *pFVar3;
  TArray<FHudPic,_FHudPic> *piclist;
  int iStack_c;
  bool newval_local;
  uint handle_local;
  
  this = GetPicList();
  uVar2 = TArray<FHudPic,_FHudPic>::Size(this);
  if (handle < uVar2) {
    pFVar3 = TArray<FHudPic,_FHudPic>::operator[](this,(ulong)handle);
    bVar1 = FTextureID::isValid(&pFVar3->texturenum);
    if (bVar1) {
      pFVar3 = TArray<FHudPic,_FHudPic>::operator[](this,(ulong)handle);
      pFVar3->draw = newval;
      iStack_c = 0;
    }
    else {
      iStack_c = -1;
    }
  }
  else {
    iStack_c = -1;
  }
  return iStack_c;
}

Assistant:

int HU_FSDisplay(unsigned handle, bool newval)
{
	TArray<FHudPic> &piclist=GetPicList();
	
	if(handle >= piclist.Size()) return -1;
	if(!piclist[handle].texturenum.isValid()) return -1;

	piclist[handle].draw = newval;
	return 0;
}